

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

int canvas_undo_canvas_apply(_glist *x,void *z,int action)

{
  ushort uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ushort uVar9;
  int iVar10;
  byte bVar11;
  
  if (action - 1U < 2) {
    uVar1 = *(ushort *)&x->field_0xe8;
    if ((uVar1 & 0x20) == 0) {
      canvas_editmode(x,1.0);
      uVar1 = *(ushort *)&x->field_0xe8;
    }
    uVar2 = *z;
    uVar3 = *(undefined8 *)((long)z + 8);
    uVar4 = *(undefined8 *)((long)z + 0x10);
    uVar5 = *(undefined8 *)&x->gl_x1;
    uVar6 = *(undefined8 *)&x->gl_x2;
    x->gl_x1 = (t_float)(int)uVar3;
    x->gl_y1 = (t_float)(int)((ulong)uVar3 >> 0x20);
    x->gl_x2 = (t_float)(int)uVar4;
    x->gl_y2 = (t_float)(int)((ulong)uVar4 >> 0x20);
    uVar3 = *(undefined8 *)&x->gl_pixwidth;
    x->gl_pixwidth = (int)uVar2;
    x->gl_pixheight = (int)((ulong)uVar2 >> 0x20);
    uVar2 = *(undefined8 *)((long)z + 0x18);
    uVar4 = *(undefined8 *)((long)z + 0x20);
    uVar7 = *(undefined8 *)&x->gl_screenx1;
    uVar8 = *(undefined8 *)&x->gl_screenx2;
    x->gl_screenx1 = (int)uVar2;
    x->gl_screeny1 = (int)((ulong)uVar2 >> 0x20);
    x->gl_screenx2 = (int)uVar4;
    x->gl_screeny2 = (int)((ulong)uVar4 >> 0x20);
    uVar2 = *(undefined8 *)((long)z + 0x28);
    uVar4 = *(undefined8 *)&x->gl_xmargin;
    x->gl_xmargin = (int)uVar2;
    x->gl_ymargin = (int)((ulong)uVar2 >> 0x20);
    bVar11 = *(char *)((long)z + 0x30) << 7;
    *(ushort *)&x->field_0xe8 = (ushort)bVar11 | uVar1 & 0xff7f;
    uVar9 = (ushort)((*(uint *)((long)z + 0x30) & 2) << 7);
    *(ushort *)&x->field_0xe8 = (ushort)bVar11 | uVar1 & 0xfe7f | uVar9;
    *(ushort *)&x->field_0xe8 =
         (ushort)bVar11 | uVar1 & 0xfc7f | uVar9 | (ushort)((*(uint *)((long)z + 0x30) & 4) << 7);
    *(undefined8 *)z = uVar3;
    *(undefined8 *)((long)z + 8) = uVar5;
    *(undefined8 *)((long)z + 0x10) = uVar6;
    *(undefined8 *)((long)z + 0x18) = uVar7;
    *(undefined8 *)((long)z + 0x20) = uVar8;
    *(undefined8 *)((long)z + 0x28) = uVar4;
    *(byte *)((long)z + 0x30) =
         (byte)(uVar1 >> 7) & 6 | (byte)(uVar1 >> 7) & 1 | *(byte *)((long)z + 0x30) & 0xf8;
    canvas_setgraph(x,(byte)x->field_0xe9 & 3,0);
    canvas_dirty(x,1.0);
    if ((x->field_0xe8 & 1) != 0) {
      canvas_redraw(x);
    }
    if ((x->gl_owner != (_glist *)0x0) && ((x->field_0xe9 & 8) == 0)) {
      iVar10 = glist_isvisible(x->gl_owner);
      if (iVar10 != 0) {
        glist_noselect(x);
        gobj_vis((t_gobj *)x,x->gl_owner,0);
        gobj_vis((t_gobj *)x,x->gl_owner,1);
        if ((x->gl_owner->field_0xe8 & 1) != 0) {
          canvas_redraw(x->gl_owner);
        }
      }
    }
  }
  else if (z != (void *)0x0 && action == 0) {
    freebytes(z,0x34);
  }
  return 1;
}

Assistant:

int canvas_undo_canvas_apply(t_canvas *x, void *z, int action)
{
    t_undo_canvas_properties *buf = (t_undo_canvas_properties *)z;
    t_undo_canvas_properties tmp;

    if (action == UNDO_UNDO || action == UNDO_REDO)
    {
        if (!x->gl_edit)
            canvas_editmode(x, 1);
#if 0
            /* close properties window first */
        t_int properties = gfxstub_haveproperties((void *)x);
        if (properties)
        {
            pdgui_stub_deleteforkey(x);
        }
#endif
            /* store current canvas values into temporary data holder */
        tmp.gl_pixwidth = x->gl_pixwidth;
        tmp.gl_pixheight = x->gl_pixheight;
        tmp.gl_x1 = x->gl_x1;
        tmp.gl_y1 = x->gl_y1;
        tmp.gl_x2 = x->gl_x2;
        tmp.gl_y2 = x->gl_y2;
        tmp.gl_screenx1 = x->gl_screenx1;
        tmp.gl_screeny1 = x->gl_screeny1;
        tmp.gl_screenx2 = x->gl_screenx2;
        tmp.gl_screeny2 = x->gl_screeny2;
        tmp.gl_xmargin = x->gl_xmargin;
        tmp.gl_ymargin = x->gl_ymargin;
        tmp.gl_goprect = x->gl_goprect;
        tmp.gl_isgraph = x->gl_isgraph;
        tmp.gl_hidetext = x->gl_hidetext;

            /* change canvas values with the ones from the undo buffer */
        x->gl_pixwidth = buf->gl_pixwidth;
        x->gl_pixheight = buf->gl_pixheight;
        x->gl_x1 = buf->gl_x1;
        x->gl_y1 = buf->gl_y1;
        x->gl_x2 = buf->gl_x2;
        x->gl_y2 = buf->gl_y2;
        x->gl_screenx1 = buf->gl_screenx1;
        x->gl_screeny1 = buf->gl_screeny1;
        x->gl_screenx2 = buf->gl_screenx2;
        x->gl_screeny2 = buf->gl_screeny2;
        x->gl_xmargin = buf->gl_xmargin;
        x->gl_ymargin = buf->gl_ymargin;
        x->gl_goprect = buf->gl_goprect;
        x->gl_isgraph = buf->gl_isgraph;
        x->gl_hidetext = buf->gl_hidetext;

            /* copy data values from the temporary data to the undo buffer */
        buf->gl_pixwidth = tmp.gl_pixwidth;
        buf->gl_pixheight = tmp.gl_pixheight;
        buf->gl_x1 = tmp.gl_x1;
        buf->gl_y1 = tmp.gl_y1;
        buf->gl_x2 = tmp.gl_x2;
        buf->gl_y2 = tmp.gl_y2;
        buf->gl_screenx1 = tmp.gl_screenx1;
        buf->gl_screeny1 = tmp.gl_screeny1;
        buf->gl_screenx2 = tmp.gl_screenx2;
        buf->gl_screeny2 = tmp.gl_screeny2;
        buf->gl_xmargin = tmp.gl_xmargin;
        buf->gl_ymargin = tmp.gl_ymargin;
        buf->gl_goprect = tmp.gl_goprect;
        buf->gl_isgraph = tmp.gl_isgraph;
        buf->gl_hidetext = tmp.gl_hidetext;

            /* redraw */
        canvas_setgraph(x, x->gl_isgraph + 2*x->gl_hidetext, 0);
        canvas_dirty(x, 1);

        if (x->gl_havewindow)
        {
            canvas_redraw(x);
        }
        if (x->gl_owner && !x->gl_isclone && glist_isvisible(x->gl_owner))
        {
            glist_noselect(x);
            gobj_vis(&x->gl_gobj, x->gl_owner, 0);
            gobj_vis(&x->gl_gobj, x->gl_owner, 1);
            if (x->gl_owner->gl_havewindow)
                canvas_redraw(x->gl_owner);
        }
    }

    else if (action == UNDO_FREE)
    {
        if (buf)
            t_freebytes(buf, sizeof(*buf));
    }
    return 1;
}